

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O1

int ecp_mod_p256(mbedtls_mpi *N)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  ushort uVar3;
  mbedtls_mpi_uint *pmVar4;
  mbedtls_mpi_uint mVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  
  iVar7 = mbedtls_mpi_grow(N,9);
  if (iVar7 == 0) {
    pmVar4 = N->p;
    mVar5 = *pmVar4;
    uVar17 = pmVar4[4];
    uVar6 = (uint)uVar17;
    uVar10 = (uint)mVar5;
    uVar24 = uVar6 + uVar10;
    uVar15 = (uint)(uVar17 >> 0x20);
    uVar25 = uVar24 + uVar15;
    uVar18 = (uint)(pmVar4[5] >> 0x20);
    uVar26 = uVar25 - uVar18;
    uVar21 = (uint)pmVar4[6];
    uVar27 = uVar26 - uVar21;
    uVar22 = (uint)(pmVar4[6] >> 0x20);
    uVar28 = uVar27 - uVar22;
    uVar16 = (uint)pmVar4[7];
    iVar29 = uVar28 - uVar16;
    cVar9 = ((((CARRY4(uVar24,uVar15) + CARRY4(uVar6,uVar10)) - (uVar25 < uVar18)) -
             (uVar26 < uVar21)) - (uVar27 < uVar22)) - (uVar28 < uVar16);
    *(int *)pmVar4 = iVar29;
    uVar10 = (uint)cVar9;
    uVar24 = (uint)(mVar5 >> 0x20);
    if (cVar9 < '\0') {
      cVar9 = -(uVar24 < -uVar10);
    }
    else {
      cVar9 = CARRY4(uVar10,uVar24);
    }
    uVar25 = uVar10 + uVar24 + uVar15;
    uVar20 = (uint)pmVar4[5];
    uVar26 = uVar25 + uVar20;
    uVar27 = uVar26 - uVar21;
    uVar28 = uVar27 - uVar22;
    uVar11 = uVar28 - uVar16;
    uVar30 = (uint)(pmVar4[7] >> 0x20);
    cVar9 = ((((CARRY4(uVar10 + uVar24,uVar15) + cVar9 + CARRY4(uVar25,uVar20)) - (uVar26 < uVar21))
             - (uVar27 < uVar22)) - (uVar28 < uVar16)) - (uVar11 < uVar30);
    *pmVar4 = CONCAT44(uVar11 - uVar30,iVar29);
    uVar19 = pmVar4[1];
    uVar10 = (uint)cVar9;
    uVar24 = (uint)uVar19;
    if (cVar9 < '\0') {
      cVar9 = -(uVar24 < -uVar10);
    }
    else {
      cVar9 = CARRY4(uVar10,uVar24);
    }
    uVar25 = uVar10 + uVar24 + uVar20;
    uVar26 = uVar25 + uVar18;
    uVar27 = uVar26 - uVar22;
    uVar28 = uVar27 - uVar16;
    uVar11 = uVar28 - uVar30;
    cVar9 = (((CARRY4(uVar10 + uVar24,uVar20) + cVar9 + CARRY4(uVar25,uVar18)) - (uVar26 < uVar22))
            - (uVar27 < uVar16)) - (uVar28 < uVar30);
    pmVar4[1] = uVar19 & 0xffffffff00000000 | (ulong)uVar11;
    uVar10 = (uint)cVar9;
    uVar24 = (uint)(uVar19 >> 0x20);
    if (cVar9 < '\0') {
      cVar9 = -(uVar24 < -uVar10);
    }
    else {
      cVar9 = CARRY4(uVar10,uVar24);
    }
    uVar25 = uVar10 + uVar24 + uVar18;
    uVar26 = uVar25 + uVar18;
    uVar27 = uVar26 + uVar21;
    uVar28 = uVar27 + uVar21;
    uVar12 = uVar28 + uVar22;
    uVar13 = uVar12 - uVar30;
    uVar14 = uVar13 - uVar6;
    cVar9 = (((CARRY4(uVar27,uVar21) +
               CARRY4(uVar25,uVar18) + cVar9 + CARRY4(uVar10 + uVar24,uVar18) +
               CARRY4(uVar26,uVar21) + CARRY4(uVar28,uVar22)) - (uVar12 < uVar30)) -
            (uVar13 < uVar6)) - (uVar14 < uVar15);
    pmVar4[1] = CONCAT44(uVar14 - uVar15,uVar11);
    uVar19 = pmVar4[2];
    uVar10 = (uint)cVar9;
    uVar24 = (uint)uVar19;
    if (cVar9 < '\0') {
      cVar9 = -(uVar24 < -uVar10);
    }
    else {
      cVar9 = CARRY4(uVar10,uVar24);
    }
    uVar25 = uVar10 + uVar24 + uVar21;
    uVar26 = uVar25 + uVar21;
    uVar27 = uVar26 + uVar22;
    uVar28 = uVar27 + uVar22;
    uVar11 = uVar28 + uVar16;
    uVar12 = uVar11 - uVar15;
    uVar13 = uVar12 - uVar20;
    cVar9 = ((CARRY4(uVar27,uVar22) +
              CARRY4(uVar25,uVar21) + cVar9 + CARRY4(uVar10 + uVar24,uVar21) + CARRY4(uVar26,uVar22)
             + CARRY4(uVar28,uVar16)) - (uVar11 < uVar15)) - (uVar12 < uVar20);
    pmVar4[2] = uVar19 & 0xffffffff00000000 | (ulong)uVar13;
    uVar10 = (uint)cVar9;
    uVar24 = (uint)(uVar19 >> 0x20);
    if (cVar9 < '\0') {
      cVar9 = -(uVar24 < -uVar10);
    }
    else {
      cVar9 = CARRY4(uVar10,uVar24);
    }
    uVar25 = uVar10 + uVar24 + uVar22;
    uVar26 = uVar25 + uVar22;
    uVar27 = uVar26 + uVar16;
    uVar28 = uVar27 + uVar16;
    uVar11 = uVar28 + uVar30;
    uVar12 = uVar11 - uVar20;
    cVar9 = ((CARRY4(uVar27,uVar16) +
              CARRY4(uVar25,uVar22) + cVar9 + CARRY4(uVar10 + uVar24,uVar22) + CARRY4(uVar26,uVar16)
             + CARRY4(uVar28,uVar30)) - (uVar11 < uVar20)) - (uVar12 < uVar18);
    pmVar4[2] = CONCAT44(uVar12 - uVar18,uVar13);
    uVar19 = pmVar4[3];
    uVar10 = (uint)cVar9;
    uVar24 = (uint)uVar19;
    if (cVar9 < '\0') {
      cVar9 = -(uVar24 < -uVar10);
    }
    else {
      cVar9 = CARRY4(uVar10,uVar24);
    }
    uVar25 = uVar10 + uVar24 + uVar16;
    uVar26 = uVar25 + uVar16;
    uVar27 = uVar26 + uVar30;
    uVar28 = uVar27 + uVar30;
    uVar11 = uVar28 + uVar16;
    uVar12 = uVar11 + uVar22;
    uVar13 = uVar12 - uVar6;
    uVar14 = uVar13 - uVar15;
    cVar9 = ((CARRY4(uVar28,uVar16) +
              CARRY4(uVar26,uVar30) + CARRY4(uVar10 + uVar24,uVar16) + cVar9 + CARRY4(uVar25,uVar16)
              + CARRY4(uVar27,uVar30) + CARRY4(uVar11,uVar22)) - (uVar12 < uVar6)) -
            (uVar13 < uVar15);
    pmVar4[3] = uVar19 & 0xffffffff00000000 | (ulong)uVar14;
    uVar10 = (uint)cVar9;
    uVar24 = (uint)(uVar19 >> 0x20);
    if (cVar9 < '\0') {
      cVar9 = -(uVar24 < -uVar10);
    }
    else {
      cVar9 = CARRY4(uVar10,uVar24);
    }
    uVar15 = uVar10 + uVar24 + uVar30;
    uVar25 = uVar15 + uVar30;
    uVar26 = uVar25 + uVar30;
    uVar27 = uVar26 + uVar6;
    uVar28 = uVar27 - uVar20;
    uVar16 = uVar28 - uVar18;
    uVar11 = uVar16 - uVar21;
    bVar23 = ((((CARRY4(uVar25,uVar30) +
                 CARRY4(uVar10 + uVar24,uVar30) + cVar9 + CARRY4(uVar15,uVar30) +
                CARRY4(uVar26,uVar6)) - (uVar27 < uVar20)) - (uVar28 < uVar18)) - (uVar16 < uVar21))
             - (uVar11 < uVar22);
    pmVar4[3] = CONCAT44(uVar11 - uVar22,uVar14);
    uVar19 = 0;
    if ('\0' < (char)bVar23) {
      uVar19 = (ulong)bVar23;
    }
    pmVar4[4] = uVar19 | uVar17 & 0xffffffff00000000;
    uVar3 = N->n;
    if (4 < uVar3) {
      uVar17 = 9;
      do {
        uVar19 = 0xffffffff;
        if (((int)uVar17 - 1U & 1) != 0) {
          uVar19 = 0xffffffff00000000;
        }
        puVar1 = (ulong *)((long)pmVar4 + (uVar17 & 0xfffffffffffffffe) * 4);
        *puVar1 = *puVar1 & uVar19;
        uVar17 = uVar17 + 1;
      } while ((uint)uVar3 + (uint)uVar3 != uVar17);
    }
    if ((char)bVar23 < '\0') {
      lVar8 = 0;
      do {
        pmVar4[lVar8] = ~pmVar4[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      uVar17 = 0;
      do {
        pmVar2 = pmVar4 + uVar17;
        *pmVar2 = *pmVar2 + 1;
        if (3 < uVar17) break;
        uVar17 = uVar17 + 1;
      } while (*pmVar2 == 0);
      N->s = -1;
      pmVar4[4] = pmVar4[4] - (long)(char)bVar23;
    }
  }
  return iVar7;
}

Assistant:

static int ecp_mod_p256(mbedtls_mpi *N)
{
    INIT(256);

    ADD(8); ADD(9);
    SUB(11); SUB(12); SUB(13); SUB(14);             NEXT;         // A0

    ADD(9); ADD(10);
    SUB(12); SUB(13); SUB(14); SUB(15);             NEXT;         // A1

    ADD(10); ADD(11);
    SUB(13); SUB(14); SUB(15);                        NEXT;       // A2

    ADD(11); ADD(11); ADD(12); ADD(12); ADD(13);
    SUB(15); SUB(8); SUB(9);                        NEXT;         // A3

    ADD(12); ADD(12); ADD(13); ADD(13); ADD(14);
    SUB(9); SUB(10);                                   NEXT;      // A4

    ADD(13); ADD(13); ADD(14); ADD(14); ADD(15);
    SUB(10); SUB(11);                                   NEXT;     // A5

    ADD(14); ADD(14); ADD(15); ADD(15); ADD(14); ADD(13);
    SUB(8); SUB(9);                                   NEXT;       // A6

    ADD(15); ADD(15); ADD(15); ADD(8);
    SUB(10); SUB(11); SUB(12); SUB(13);             LAST;         // A7

cleanup:
    return ret;
}